

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_add_hs_msg_to_checksum
              (mbedtls_ssl_context *ssl,uint hs_type,uchar *msg,size_t msg_len)

{
  int iVar1;
  uchar local_24 [8];
  uchar hs_hdr [4];
  
  iVar1 = (*ssl->handshake->update_checksum)(ssl,local_24,4);
  if (iVar1 == 0) {
    iVar1 = (*ssl->handshake->update_checksum)(ssl,msg,msg_len);
  }
  return iVar1;
}

Assistant:

int mbedtls_ssl_add_hs_msg_to_checksum(mbedtls_ssl_context *ssl,
                                       unsigned hs_type,
                                       unsigned char const *msg,
                                       size_t msg_len)
{
    int ret;
    ret = mbedtls_ssl_add_hs_hdr_to_checksum(ssl, hs_type, msg_len);
    if (ret != 0) {
        return ret;
    }
    return ssl->handshake->update_checksum(ssl, msg, msg_len);
}